

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O1

void __thiscall PSVIWriterHandlers::processFields(PSVIWriterHandlers *this,StringList *fields)

{
  char16_t *xpath;
  uint uVar1;
  XMLSize_t getAt;
  
  writeOpen(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgFields);
  incIndent(this);
  if ((fields->super_BaseRefVectorOf<char16_t>).fCurCount != 0) {
    uVar1 = 1;
    getAt = 0;
    do {
      xpath = xercesc_4_0::BaseRefVectorOf<char16_t>::elementAt
                        (&fields->super_BaseRefVectorOf<char16_t>,getAt);
      processXPath(this,xpath);
      getAt = (XMLSize_t)uVar1;
      uVar1 = uVar1 + 1;
    } while (getAt < (fields->super_BaseRefVectorOf<char16_t>).fCurCount);
  }
  sendUnindentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgFields);
  return;
}

Assistant:

void PSVIWriterHandlers::processFields(StringList* fields) {
	sendIndentedElement(PSVIUni::fgFields);
	for (unsigned int i=0; i < fields->size(); i++) {
		processXPath(fields->elementAt(i));
	}
	sendUnindentedElement(PSVIUni::fgFields);
}